

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)

{
  SQObjectPtr *pSVar1;
  SQString *x;
  SQVM *in_RCX;
  SQObjectType in_EDX;
  SQVM *in_RDI;
  bool bVar2;
  SQObjectPtr oval;
  SQInteger in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQObjectValue in_stack_ffffffffffffffd0;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (in_RCX->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted = (_func_int **)pSVar1;
  bVar2 = *(SQObjectType *)(in_RCX->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted ==
          in_EDX;
  if (!bVar2) {
    x = SQVM::PrintObjVal(in_RCX,in_stack_ffffffffffffffd0.pString);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc8,x);
    pSVar1 = (SQObjectPtr *)IdType2Name(in_EDX);
    SQVM::Raise_Error(in_RDI,"wrong argument type, expected \'%s\' got \'%.50s\'",pSVar1,
                      &(in_stack_ffffffffffffffd0.pTable)->_firstfree);
    SQObjectPtr::~SQObjectPtr(pSVar1);
  }
  return bVar2;
}

Assistant:

static bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)
{
    *o = &stack_get(v,idx);
    if(type(**o) != type){
        SQObjectPtr oval = v->PrintObjVal(**o);
        v->Raise_Error(_SC("wrong argument type, expected '%s' got '%.50s'"),IdType2Name(type),_stringval(oval));
        return false;
    }
    return true;
}